

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coding.c
# Opt level: O0

exr_result_t
internal_encode_free_buffer
          (exr_encode_pipeline_t *encode,exr_transcoding_pipeline_buffer_id_t bufid,void **buf,
          size_t *sz)

{
  long lVar1;
  long lVar2;
  exr_result_t eVar3;
  long *in_RCX;
  long *in_RDX;
  undefined4 in_ESI;
  long in_RDI;
  exr_const_context_t ctxt;
  size_t cursz;
  void *curbuf;
  
  lVar1 = *in_RDX;
  if (lVar1 != 0) {
    if (*in_RCX != 0) {
      if (*(long *)(in_RDI + 0xe8) == 0) {
        lVar2 = *(long *)(in_RDI + 0x18);
        if (lVar2 == 0) {
          return 2;
        }
        if ((*(int *)(in_RDI + 0x14) < 0) || (*(int *)(lVar2 + 0xc4) <= *(int *)(in_RDI + 0x14))) {
          eVar3 = (**(code **)(lVar2 + 0x48))
                            (lVar2,4,"Part index (%d) out of range",*(undefined4 *)(in_RDI + 0x14));
          return eVar3;
        }
        (**(code **)(lVar2 + 0x60))(lVar1);
      }
      else {
        (**(code **)(in_RDI + 0xe8))(in_ESI,lVar1);
      }
    }
    *in_RDX = 0;
  }
  *in_RCX = 0;
  return 0;
}

Assistant:

exr_result_t
internal_encode_free_buffer (
    exr_encode_pipeline_t*               encode,
    exr_transcoding_pipeline_buffer_id_t bufid,
    void**                               buf,
    size_t*                              sz)
{
    void*  curbuf = *buf;
    size_t cursz  = *sz;
    if (curbuf)
    {
        if (cursz > 0)
        {
            if (encode->free_fn)
                encode->free_fn (bufid, curbuf);
            else
            {
                exr_const_context_t ctxt = encode->context;
                EXR_CHECK_CONTEXT_AND_PART (encode->part_index);

                ctxt->free_fn (curbuf);
            }
        }
        *buf = NULL;
    }
    *sz = 0;
    return EXR_ERR_SUCCESS;
}